

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  cmake *pcVar2;
  iterator __position;
  pointer pcVar3;
  undefined *puVar4;
  pointer pGVar5;
  bool bVar6;
  string *psVar7;
  cmMakefile *pcVar8;
  pointer ppcVar9;
  ostream *poVar10;
  pointer ppcVar11;
  __hashtable *__h;
  pointer gti;
  undefined **ppuVar12;
  cmMakefile *dirMf;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  ostringstream msg;
  cmStateSnapshot snapshot;
  char num [100];
  cmMakefile *local_458;
  string local_450;
  pointer local_430;
  cmGlobalGenerator *local_428;
  pointer local_420;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  local_418;
  undefined1 local_400 [32];
  undefined1 local_3e0 [456];
  cmStateSnapshot local_218;
  cmTarget local_1f8;
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar2 = this->CMakeInstance;
  local_218.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_218.State = (pcVar2->CurrentSnapshot).State;
  local_218.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_400,&local_218);
  psVar7 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_400,psVar7);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_400,&local_218);
  psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_400,psVar7);
  pcVar8 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar8,this,&local_218);
  local_458 = pcVar8;
  cmMakefile::SetRecursionDepth(pcVar8,this->RecursionDepth);
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_458);
  }
  else {
    *__position._M_current = local_458;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  IndexMakefile(this,local_458);
  psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar7);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_458);
  cmMakefile::EnforceDirectoryLevelRules(local_458);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_418.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (GlobalTargetInfo *)0x0;
  local_418.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (GlobalTargetInfo *)0x0;
  local_418.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&local_418);
  ppcVar9 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_420 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ppcVar11 = ppcVar9;
  if (ppcVar9 != local_420) {
    local_428 = this;
    do {
      pGVar5 = local_418.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_430 = ppcVar9;
      if (local_418.
          super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_418.
          super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar8 = *ppcVar9;
        gti = local_418.
              super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          CreateGlobalTarget(&local_1f8,local_428,gti,pcVar8);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
          ::pair<cmTarget,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                      *)local_400,&gti->Name,&local_1f8);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,cmTarget>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pcVar8->Targets,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                      *)local_400);
          cmTarget::~cmTarget((cmTarget *)local_3e0);
          if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_400._0_8_ !=
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_400 + 0x10)) {
            operator_delete((void *)local_400._0_8_,(ulong)(local_400._16_8_ + 1));
          }
          cmTarget::~cmTarget(&local_1f8);
          gti = gti + 1;
        } while (gti != pGVar5);
      }
      ppcVar9 = local_430 + 1;
    } while (ppcVar9 != local_420);
    ppcVar9 = (local_428->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppcVar11 = (local_428->Makefiles).
               super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    this = local_428;
  }
  sprintf(&local_1f8.IsGeneratorProvided,"%d",(ulong)((long)ppcVar11 - (long)ppcVar9) >> 3);
  pcVar2 = this->CMakeInstance;
  local_400._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_400 + 0x10)
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_400,"CMAKE_NUMBER_OF_MAKEFILES","");
  cmake::AddCacheEntry
            (pcVar2,(string *)local_400,&local_1f8.IsGeneratorProvided,"number of local generators",
             4);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_400._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_400 + 0x10)) {
    operator_delete((void *)local_400._0_8_,(ulong)(local_400._16_8_ + 1));
  }
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_400,"Configuring incomplete, errors occurred!",0x28);
      ppuVar12 = &PTR_anon_var_dwarf_279388_006229a8;
      do {
        psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_450,pcVar3,pcVar3 + psVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_450);
        std::__cxx11::string::append((char *)&local_450);
        std::__cxx11::string::append((char *)&local_450);
        bVar6 = cmsys::SystemTools::FileExists(&local_450);
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_400,"\nSee also \"",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_400,local_450._M_dataplus._M_p,
                               local_450._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".",2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        puVar4 = *ppuVar12;
        ppuVar12 = ppuVar12 + 1;
      } while (puVar4 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_400,"Configuring done",0x10);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,&local_450,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
    std::ios_base::~ios_base((ios_base *)(local_3e0 + 0x50));
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&local_418);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  std::vector<GlobalTargetInfo> globalTargets;
  this->CreateDefaultGlobalTargets(globalTargets);

  for (cmMakefile* mf : this->Makefiles) {
    cmTargets* targets = &(mf->GetTargets());
    for (GlobalTargetInfo const& globalTarget : globalTargets) {
      targets->insert(cmTargets::value_type(
        globalTarget.Name, this->CreateGlobalTarget(globalTarget, mf)));
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += "/CMakeFiles";
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}